

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O0

spvc_result
spvc_compiler_type_struct_member_offset
          (spvc_compiler compiler,spvc_type type,uint index,uint *offset)

{
  uint32_t uVar1;
  pointer this;
  exception *e;
  uint *offset_local;
  uint index_local;
  spvc_type type_local;
  spvc_compiler compiler_local;
  
  this = std::unique_ptr<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>::
         operator->(&compiler->compiler);
  uVar1 = spirv_cross::Compiler::type_struct_member_offset(this,(SPIRType *)type,index);
  *offset = uVar1;
  return SPVC_SUCCESS;
}

Assistant:

spvc_result spvc_compiler_type_struct_member_offset(spvc_compiler compiler, spvc_type type, unsigned index, unsigned *offset)
{
	SPVC_BEGIN_SAFE_SCOPE
	{
		*offset = compiler->compiler->type_struct_member_offset(*static_cast<const SPIRType *>(type), index);
	}